

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_aesgcmsiv.cc
# Opt level: O0

void anon_unknown.dwarf_208998::aead_aes_gcm_siv_kdf
               (int is_128_bit,aead_aes_gcm_siv_asm_ctx *gcm_siv_ctx,uint64_t *out_record_auth_key,
               uint64_t *out_record_enc_key,uint8_t *nonce)

{
  uint64_t local_a8;
  uint64_t key_material [12];
  uint8_t padded_nonce [16];
  uint8_t *nonce_local;
  uint64_t *out_record_enc_key_local;
  uint64_t *out_record_auth_key_local;
  aead_aes_gcm_siv_asm_ctx *gcm_siv_ctx_local;
  int is_128_bit_local;
  
  ::OPENSSL_memcpy(key_material + 0xb,nonce,0xc);
  if (is_128_bit == 0) {
    aes256gcmsiv_kdf(key_material + 0xb,&local_a8,gcm_siv_ctx);
    *out_record_enc_key = key_material[3];
    out_record_enc_key[1] = key_material[5];
    out_record_enc_key[2] = key_material[7];
    out_record_enc_key[3] = key_material[9];
  }
  else {
    aes128gcmsiv_kdf(key_material + 0xb,&local_a8,gcm_siv_ctx);
    *out_record_enc_key = key_material[3];
    out_record_enc_key[1] = key_material[5];
  }
  *out_record_auth_key = local_a8;
  out_record_auth_key[1] = key_material[1];
  return;
}

Assistant:

void aead_aes_gcm_siv_kdf(int is_128_bit,
                          const struct aead_aes_gcm_siv_asm_ctx *gcm_siv_ctx,
                          uint64_t out_record_auth_key[2],
                          uint64_t out_record_enc_key[4],
                          const uint8_t nonce[12]) {
  alignas(16) uint8_t padded_nonce[16];
  OPENSSL_memcpy(padded_nonce, nonce, 12);

  alignas(16) uint64_t key_material[12];
  if (is_128_bit) {
    aes128gcmsiv_kdf(padded_nonce, key_material, &gcm_siv_ctx->key[0]);
    out_record_enc_key[0] = key_material[4];
    out_record_enc_key[1] = key_material[6];
  } else {
    aes256gcmsiv_kdf(padded_nonce, key_material, &gcm_siv_ctx->key[0]);
    out_record_enc_key[0] = key_material[4];
    out_record_enc_key[1] = key_material[6];
    out_record_enc_key[2] = key_material[8];
    out_record_enc_key[3] = key_material[10];
  }

  out_record_auth_key[0] = key_material[0];
  out_record_auth_key[1] = key_material[2];
}